

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O2

bool __thiscall
helics::tcp::TcpComms::establishBrokerConnection
          (TcpComms *this,shared_ptr<gmlc::networking::AsioContextManager> *ioctx,
          shared_ptr<gmlc::networking::TcpConnection> *brokerConnection)

{
  string *this_00;
  __int_type_conflict _Var1;
  _Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_> _Var2;
  TcpConnection *this_01;
  element_type *peVar3;
  byte bVar4;
  int iVar5;
  string *address;
  size_t __n;
  void *__buf;
  ConnectionStatus status;
  long lVar7;
  uint uVar8;
  bool bVar9;
  string_view string2;
  string_view message;
  string_view string1;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> brkprt;
  anon_class_16_2_8f9776d2 terminate;
  string local_278;
  long local_258;
  BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *local_250;
  __shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> local_248 [2];
  SocketFactory local_228;
  BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
  *local_210;
  optional<std::pair<helics::route_id,_helics::ActionMessage>_> mess;
  vector<char,_std::allocator<char>_> rx;
  ActionMessage m;
  pointer pcVar6;
  
  iVar5 = (this->super_NetworkCommsInterface).brokerPort;
  terminate.this = this;
  terminate.brokerConnection = brokerConnection;
  if (iVar5 < 0) {
    iVar5 = getDefaultPort(6);
    (this->super_NetworkCommsInterface).brokerPort = iVar5;
  }
  if ((this->super_NetworkCommsInterface).encrypted == true) {
    gmlc::networking::SocketFactory::SocketFactory(&local_228,&this->encryption_config,true);
    iVar5 = (this->super_NetworkCommsInterface).brokerPort;
  }
  else {
    local_228.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
    super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_228.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
    super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.encrypted = false;
    local_228.handshake_server = false;
    local_228._18_6_ = 0;
  }
  _Var2.super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl =
       (((ioctx->
         super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr)->ictx)._M_t.
       super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
       super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
       super__Head_base<0UL,_asio::io_context_*,_false>;
  CLI::std::__cxx11::to_string((string *)&mess,iVar5);
  gmlc::networking::establishConnection
            ((networking *)&m,&local_228,
             (io_context *)_Var2.super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,
             &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress,
             (string *)&mess,
             (milliseconds)
             (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r);
  std::__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&brokerConnection->
              super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)&m);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m.source_id);
  std::__cxx11::string::~string((string *)&mess);
  this_00 = &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress;
  uVar8 = 0;
  while (_Var1 = (this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base.
                 _M_i,
        (brokerConnection->
        super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        (element_type *)0x0) {
    if ((_Var1 & 1U) != 0) {
LAB_00259684:
      status = TERMINATED;
      goto LAB_00259b8c;
    }
    if (uVar8 == 0) {
      message._M_str = "initial connection to broker timed out ";
      message._M_len = 0x27;
      CommsInterface::logWarning((CommsInterface *)this,message);
    }
    if ((this->super_NetworkCommsInterface).maxRetries <= (int)uVar8) {
      message_03._M_str = "initial connection to broker timed out exceeding max number of retries ";
      message_03._M_len = 0x47;
      CommsInterface::logWarning((CommsInterface *)this,message_03);
      status = ERRORED;
      goto LAB_00259b8c;
    }
    if ((uVar8 & 1) == 0) {
      sched_yield();
    }
    else {
      mess.super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>.
      _M_payload.
      super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
      .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>._M_payload.
      _0_8_ = 100;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&mess);
    }
    if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base._M_i &
        1U) != 0) goto LAB_00259684;
    uVar8 = uVar8 + 1;
    _Var2.super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl =
         (((ioctx->
           super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr)->ictx)._M_t.
         super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
         super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
         super__Head_base<0UL,_asio::io_context_*,_false>;
    CLI::std::__cxx11::to_string((string *)&mess,(this->super_NetworkCommsInterface).brokerPort);
    gmlc::networking::establishConnection
              ((networking *)&m,&local_228,
               (io_context *)_Var2.super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,
               this_00,(string *)&mess,
               (milliseconds)
               (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r);
    std::__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&brokerConnection->
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)&m);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&m.source_id);
    std::__cxx11::string::~string((string *)&mess);
  }
  status = TERMINATED;
  if ((_Var1 & 1U) == 0) {
    lVar7 = 0;
    bVar4 = (this->super_NetworkCommsInterface).noAckConnection;
    if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
      bVar4 = 0;
    }
    local_210 = (BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
                 *)&(this->super_NetworkCommsInterface).super_CommsInterface.txQueue;
    local_250 = (BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                &this->rxMessageQueue;
    do {
      if ((bVar4 & 1) != 0) {
        uVar8 = 0;
        break;
      }
      ActionMessage::ActionMessage(&m,cmd_protocol_priority);
      m.messageID = 0x12d;
      if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
        m.messageID = 0x5af;
      }
      pcVar6 = (this->super_NetworkCommsInterface).super_CommsInterface.brokerInitString._M_dataplus
               ._M_p;
      __n = (this->super_NetworkCommsInterface).super_CommsInterface.brokerInitString.
            _M_string_length;
      string2._M_str = pcVar6;
      string2._M_len = __n;
      string1._M_str =
           (this->super_NetworkCommsInterface).super_CommsInterface.brokerName._M_dataplus._M_p;
      string1._M_len =
           (this->super_NetworkCommsInterface).super_CommsInterface.brokerName._M_string_length;
      ActionMessage::setStringData(&m,string1,string2);
      iVar5 = (int)pcVar6;
      this_01 = (brokerConnection->
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      ActionMessage::packetize_abi_cxx11_((string *)&mess,&m);
      gmlc::networking::TcpConnection::send
                (this_01,(int)(_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>
                               *)&mess,__buf,__n,iVar5);
      std::__cxx11::string::~string((string *)&mess);
      std::vector<char,_std::allocator<char>_>::vector(&rx,0x200,(allocator_type *)&mess);
      peVar3 = (((brokerConnection->
                 super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->socket_).
               super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      mess.super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>.
      _M_payload.
      super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
      .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>._M_payload.
      _24_8_ = std::
               _Function_handler<void_(const_std::error_code_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpComms.cpp:311:33)>
               ::_M_invoke;
      mess.super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>.
      _M_payload.
      super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
      .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>._M_payload.
      _16_8_ = std::
               _Function_handler<void_(const_std::error_code_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpComms.cpp:311:33)>
               ::_M_manager;
      mess.super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>.
      _M_payload.
      super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
      .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>._M_payload.
      _0_8_ = this;
      mess.super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>.
      _M_payload.
      super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
      .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>._M_payload.
      _8_8_ = &rx;
      (*peVar3->_vptr_Socket[3])
                (peVar3,rx.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,0x80,
                 (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                 &mess);
      CLI::std::_Function_base::~_Function_base((_Function_base *)&mess);
      gmlc::containers::
      BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
      ::pop<std::chrono::duration<long,std::ratio<1l,1000l>>>
                (&mess,local_210,(duration<long,_std::ratio<1L,_1000L>_>)0xc8);
      if (mess.
          super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>.
          _M_payload.
          super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
          .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>.
          _M_engaged == true) {
        if (((mess.
              super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
              .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>.
              _M_payload._M_value.second.messageAction != cmd_protocol_priority) &&
            (mess.
             super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>.
             _M_payload.
             super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
             .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>.
             _M_payload._M_value.second.messageAction != cmd_protocol_big)) &&
           (mess.
            super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
            .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>.
            _M_payload._M_value.second.messageAction != cmd_protocol)) {
          message_01._M_str = "unexpected message received in transmit queue";
          message_01._M_len = 0x2d;
          CommsInterface::logWarning((CommsInterface *)this,message_01);
          goto LAB_00259a23;
        }
        if ((mess.
             super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>.
             _M_payload.
             super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
             .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>.
             _M_payload._M_value.second.messageID == 0x5ab) &&
           ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1)) {
          bVar4 = 1;
          gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>
          ::push<helics::ActionMessage&>
                    (local_250,
                     &mess.
                      super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>
                      ._M_payload._M_value.second);
          uVar8 = 4;
        }
        else if ((mess.
                  super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
                  .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>
                  ._M_payload._M_value.second.messageID == 0x130) &&
                (0 < (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i))
        {
          bVar4 = 1;
LAB_00259915:
          uVar8 = 4;
        }
        else if (mess.
                 super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
                 .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>.
                 _M_payload._M_value.second.messageID == 0x14d) {
          iVar5 = 0x1a;
          message_02._M_str = "got new broker information";
          message_02._M_len = 0x1a;
          CommsInterface::logMessage((CommsInterface *)this,message_02);
          gmlc::networking::TcpConnection::close
                    ((brokerConnection->
                     super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr,iVar5);
          address = ActionMessage::getString_abi_cxx11_
                              (&mess.
                                super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>
                                ._M_payload._M_value.second,0);
          gmlc::networking::extractInterfaceAndPort(&brkprt,(string *)address);
          (this->super_NetworkCommsInterface).brokerPort = brkprt.second;
          local_258 = lVar7;
          bVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&brkprt,"?");
          if (!bVar9) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&brkprt);
          }
          _Var2.super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl =
               (((ioctx->
                 super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->ictx)._M_t.
               super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
               super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
               super__Head_base<0UL,_asio::io_context_*,_false>;
          CLI::std::__cxx11::to_string(&local_278,(this->super_NetworkCommsInterface).brokerPort);
          gmlc::networking::establishConnection
                    ((networking *)local_248,&local_228,
                     (io_context *)
                     _Var2.super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,this_00,
                     (string *)&local_278,
                     (milliseconds)
                     (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r)
          ;
          std::__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&brokerConnection->
                      super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                     ,local_248);
          CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_248[0]._M_refcount);
          std::__cxx11::string::~string((string *)&local_278);
          lVar7 = local_258;
          uVar8 = 4;
          std::__cxx11::string::~string((string *)&brkprt);
        }
        else {
          if (mess.
              super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
              .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>.
              _M_payload._M_value.second.messageID == 0xed3) {
            brkprt.first._M_dataplus._M_p = (pointer)0x2;
            std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                      ((duration<long,_std::ratio<1L,_1L>_> *)&brkprt);
            goto LAB_00259915;
          }
          if (mess.
              super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
              .super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>.
              _M_payload._M_value.second.messageID != 0x9db) {
            gmlc::containers::
            BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
            push<helics::ActionMessage&>
                      (local_250,
                       &mess.
                        super__Optional_base<std::pair<helics::route_id,_helics::ActionMessage>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::pair<helics::route_id,_helics::ActionMessage>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>
                        ._M_payload._M_value.second);
            goto LAB_00259a23;
          }
          establishBrokerConnection::anon_class_16_2_8f9776d2::operator()(&terminate,TERMINATED);
          uVar8 = 1;
        }
      }
      else {
        lVar7 = lVar7 + 200;
        if ((this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r <= lVar7)
        {
          (*((((brokerConnection->
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->socket_).
             super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_Socket[0xb])();
          message_00._M_str = "port number query to broker timed out";
          message_00._M_len = 0x25;
          CommsInterface::logError((CommsInterface *)this,message_00);
          establishBrokerConnection::anon_class_16_2_8f9776d2::operator()(&terminate,ERRORED);
          uVar8 = 1;
          goto LAB_00259a26;
        }
LAB_00259a23:
        uVar8 = 0;
      }
LAB_00259a26:
      std::_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>::_M_reset
                ((_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_> *)
                 &mess);
      CLI::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&rx);
      ActionMessage::~ActionMessage(&m);
    } while ((uVar8 & 3) == 0);
    bVar9 = uVar8 == 0;
  }
  else {
LAB_00259b8c:
    establishBrokerConnection::anon_class_16_2_8f9776d2::operator()(&terminate,status);
    bVar9 = false;
  }
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&local_228.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
              super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar9;
}

Assistant:

bool TcpComms::establishBrokerConnection(
    std::shared_ptr<gmlc::networking::AsioContextManager>& ioctx,
    std::shared_ptr<TcpConnection>& brokerConnection)
{
    // lambda function that does the proper termination
    auto terminate = [&, this](ConnectionStatus status) -> bool {
        if (brokerConnection) {
            brokerConnection->close();
            brokerConnection = nullptr;
        }
        setTxStatus(status);
        return false;
    };

    if (brokerPort < 0) {
        brokerPort = getDefaultBrokerPort();
    }
    try {
        auto sf = encrypted ? gmlc::networking::SocketFactory(encryption_config) :
                              gmlc::networking::SocketFactory();
        try {
            brokerConnection = gmlc::networking::establishConnection(sf,
                                                                     ioctx->getBaseContext(),
                                                                     brokerTargetAddress,
                                                                     std::to_string(brokerPort),
                                                                     connectionTimeout);
        }
        catch (std::system_error& e) {
            logWarning(std::string("network error (retrying):: ") + e.what());
            brokerConnection = nullptr;
        }
        int retries = 0;
        while (!brokerConnection) {
            if (requestDisconnect.load(std::memory_order_acquire)) {
                return terminate(ConnectionStatus::TERMINATED);
            }
            if (retries == 0) {
                logWarning("initial connection to broker timed out ");
            }
            ++retries;
            if (retries > maxRetries) {
                logWarning(
                    "initial connection to broker timed out exceeding max number of retries ");
                return terminate(ConnectionStatus::ERRORED);
            }
            if (retries % 2 == 1) {
                std::this_thread::yield();
            } else {
                std::this_thread::sleep_for(std::chrono::milliseconds(100));
            }

            if (requestDisconnect.load(std::memory_order_acquire)) {
                return terminate(ConnectionStatus::TERMINATED);
            }
            try {
                brokerConnection = gmlc::networking::establishConnection(sf,
                                                                         ioctx->getBaseContext(),
                                                                         brokerTargetAddress,
                                                                         std::to_string(brokerPort),
                                                                         connectionTimeout);
            }
            catch (std::system_error& e) {
                logWarning(std::string("network error (retry #") + std::to_string(retries) +
                           "):: " + e.what());
                brokerConnection = nullptr;
            }
        }
        if (requestDisconnect.load(std::memory_order_acquire)) {
            return terminate(ConnectionStatus::TERMINATED);
        }
        // monitor the total waiting time before connections
        std::chrono::milliseconds cumulativeSleep{0};
        const std::chrono::milliseconds popTimeout{200};

        bool connectionEstablished{false};
        if (PortNumber > 0 && NetworkCommsInterface::noAckConnection) {
            connectionEstablished = true;
        }
        while (!connectionEstablished) {
            ActionMessage m(CMD_PROTOCOL_PRIORITY);
            m.messageID = (PortNumber <= 0) ? REQUEST_PORTS : CONNECTION_REQUEST;

            m.setStringData(brokerName, brokerInitString);
            try {
                brokerConnection->send(m.packetize());
            }
            catch (const std::system_error& error) {
                logError(std::string("error in initial send to broker ") + error.what());
                return terminate(ConnectionStatus::ERRORED);
            }
            std::vector<char> rx(512);
            tcp::endpoint brk;
            brokerConnection->async_receive(
                rx.data(), 128, [this, &rx](const std::error_code& error, size_t bytes) {
                    if (!error) {
                        txReceive(rx.data(), bytes, std::string());
                    } else {
                        if (error != asio::error::operation_aborted) {
                            txReceive(rx.data(), bytes, error.message());
                        }
                    }
                });
            auto mess = txQueue.pop(popTimeout);
            if (mess) {
                if (isProtocolCommand(mess->second)) {
                    if (mess->second.messageID == PORT_DEFINITIONS) {
                        if (PortNumber <= 0) {
                            rxMessageQueue.push(mess->second);
                            connectionEstablished = true;
                            continue;
                        }
                    }
                    if (mess->second.messageID == CONNECTION_ACK) {
                        if (PortNumber > 0) {
                            connectionEstablished = true;
                            continue;
                        }
                    }
                    if (mess->second.messageID == DISCONNECT) {
                        return terminate(ConnectionStatus::TERMINATED);
                    }
                    if (mess->second.messageID == NEW_BROKER_INFORMATION) {
                        logMessage("got new broker information");
                        brokerConnection->close();

                        auto brkprt =
                            gmlc::networking::extractInterfaceAndPort(mess->second.getString(0));
                        brokerPort = brkprt.second;
                        if (brkprt.first != "?") {
                            brokerTargetAddress = brkprt.first;
                        }
                        try {
                            brokerConnection =
                                gmlc::networking::establishConnection(sf,
                                                                      ioctx->getBaseContext(),
                                                                      brokerTargetAddress,
                                                                      std::to_string(brokerPort),
                                                                      connectionTimeout);
                        }
                        catch (const std::exception& e) {
                            brokerConnection = nullptr;
                            logError(std::string(" unable to create broker connection to ") +
                                     brokerTargetAddress + "::" + e.what());
                            return terminate(ConnectionStatus::ERRORED);
                        }
                        continue;
                    }
                    if (mess->second.messageID == DELAY_CONNECTION) {
                        std::this_thread::sleep_for(std::chrono::seconds(2));
                        continue;
                    }
                    rxMessageQueue.push(mess->second);
                } else {
                    logWarning("unexpected message received in transmit queue");
                }
            } else {
                cumulativeSleep += popTimeout;
                if (cumulativeSleep >= connectionTimeout) {
                    brokerConnection->cancel();
                    logError("port number query to broker timed out");
                    return terminate(ConnectionStatus::ERRORED);
                }
            }
        }
    }
    catch (std::exception& e) {
        logError(std::string("error connecting with Broker") + e.what());
        return terminate(ConnectionStatus::ERRORED);
    }
    return true;
}